

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

NameType * __thiscall
(anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[14]>
          (Db *this,char (*args) [14])

{
  NameType *pNVar1;
  size_t sVar2;
  
  pNVar1 = (NameType *)
           anon_unknown.dwarf_3576a8::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  sVar2 = strlen(*args);
  (pNVar1->super_Node).K = KNameType;
  (pNVar1->super_Node).RHSComponentCache = No;
  (pNVar1->super_Node).ArrayCache = No;
  (pNVar1->super_Node).FunctionCache = No;
  (pNVar1->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d96e8;
  (pNVar1->Name).First = *args;
  (pNVar1->Name).Last = *args + sVar2;
  return pNVar1;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }